

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

SendInternalResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendInternal
          (SendInternalResult *__return_storage_ptr__,RpcRequest *this,bool isTailCall)

{
  NullableValue<kj::Exception> *other;
  Exception *pEVar1;
  RpcConnectionState *this_00;
  QuestionRef *this_01;
  SetupSendResult *pSVar2;
  anon_class_8_1_8991fb9c *extraout_RDX;
  anon_class_8_1_8991fb9c *extraout_RDX_00;
  anon_class_8_1_8991fb9c *func;
  ArrayPtr<unsigned_int> exports;
  Exception *exception;
  Maybe<kj::Exception> local_3b8;
  undefined1 local_220 [8];
  NullableValue<kj::Exception> _exception2597;
  Builder local_80;
  undefined1 local_48 [8];
  SetupSendResult result;
  bool isTailCall_local;
  RpcRequest *this_local;
  
  result.question._7_1_ = isTailCall;
  setupSend((SetupSendResult *)local_48,this,isTailCall);
  rpc::Call::Builder::setQuestionId
            (&this->callBuilder,
             (uint32_t)result.super_SendInternalResult.promise.super_PromiseBase.node.ptr);
  func = extraout_RDX;
  if ((result.question._7_1_ & 1) != 0) {
    rpc::Call::Builder::getSendResultsTo(&local_80,&this->callBuilder);
    rpc::Call::SendResultsTo::Builder::setYourself(&local_80);
    func = extraout_RDX_00;
  }
  exception = (Exception *)this;
  kj::
  runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendInternal(bool)::_lambda()_1_>
            (&local_3b8,(kj *)&exception,func);
  other = kj::_::readMaybe<kj::Exception>(&local_3b8);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_220,other);
  kj::Maybe<kj::Exception>::~Maybe(&local_3b8);
  pEVar1 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_220);
  if (pEVar1 != (Exception *)0x0) {
    pEVar1 = kj::_::NullableValue<kj::Exception>::operator*
                       ((NullableValue<kj::Exception> *)local_220);
    *(undefined1 *)(result._24_8_ + 0x20) = 0;
    *(undefined1 *)(result._24_8_ + 0x22) = 1;
    this_00 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                        (&this->connectionState);
    exports = kj::Array::operator_cast_to_ArrayPtr((Array *)result._24_8_);
    releaseExports(this_00,exports);
    this_01 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
              operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                          *)local_48);
    pEVar1 = kj::mv<kj::Exception>(pEVar1);
    QuestionRef::reject(this_01,pEVar1);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_220);
  pSVar2 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::SetupSendResult>
                     ((SetupSendResult *)local_48);
  SendInternalResult::SendInternalResult(__return_storage_ptr__,&pSVar2->super_SendInternalResult);
  SetupSendResult::~SetupSendResult((SetupSendResult *)local_48);
  return __return_storage_ptr__;
}

Assistant:

SendInternalResult sendInternal(bool isTailCall) {
      auto result = setupSend(isTailCall);

      // Finish and send.
      callBuilder.setQuestionId(result.questionId);
      if (isTailCall) {
        callBuilder.getSendResultsTo().setYourself();
      }
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
        KJ_CONTEXT("sending RPC call",
           callBuilder.getInterfaceId(), callBuilder.getMethodId());
        message->send();
      })) {
        // We can't safely throw the exception from here since we've already modified the question
        // table state. We'll have to reject the promise instead.
        // TODO(bug): Attempts to use the pipeline will end up sending a request referencing a
        //   bogus question ID. Can we rethrow after doing the appropriate cleanup, so the pipeline
        //   is never created? See the approach in sendForPipelineInternal() below.
        result.question.isAwaitingReturn = false;
        result.question.skipFinish = true;
        connectionState->releaseExports(result.question.paramExports);
        result.questionRef->reject(kj::mv(exception));
      }

      // Send and return.
      return kj::mv(result);
    }